

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O0

void __thiscall OpenMesh::PropertyContainer::clear(PropertyContainer *this)

{
  ClearAll local_21;
  BaseProperty **local_20;
  BaseProperty **local_18;
  PropertyContainer *local_10;
  PropertyContainer *this_local;
  
  local_10 = this;
  local_18 = (BaseProperty **)
             std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::begin
                       (&this->properties_);
  local_20 = (BaseProperty **)
             std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::end
                       (&this->properties_);
  ClearAll::ClearAll(&local_21);
  std::
  for_each<__gnu_cxx::__normal_iterator<OpenMesh::BaseProperty**,std::vector<OpenMesh::BaseProperty*,std::allocator<OpenMesh::BaseProperty*>>>,OpenMesh::PropertyContainer::ClearAll>
            (local_18,local_20);
  return;
}

Assistant:

void clear()
  {
	// Clear properties vector:
	// Replaced the old version with new one
	// which performs a swap to clear values and
	// deallocate memory.

	// Old version (changed 22.07.09) {
	// std::for_each(properties_.begin(), properties_.end(), Delete());
    // }

	std::for_each(properties_.begin(), properties_.end(), ClearAll());
  }